

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O1

Function * __thiscall soul::Module::Functions::get(Functions *this,string_view name)

{
  size_t sVar1;
  bool bVar2;
  Function *pFVar3;
  long lVar4;
  pool_ref<soul::heart::Function> *ppVar5;
  bool bVar6;
  
  sVar1 = (this->functions).numActive;
  bVar6 = sVar1 == 0;
  if (!bVar6) {
    ppVar5 = (this->functions).items;
    bVar2 = Identifier::operator==(&ppVar5->object->name,name);
    if (!bVar2) {
      lVar4 = sVar1 * 8;
      do {
        lVar4 = lVar4 + -8;
        bVar6 = lVar4 == 0;
        if (bVar6) goto LAB_001cb3fc;
        ppVar5 = ppVar5 + 1;
        bVar2 = Identifier::operator==(&ppVar5->object->name,name);
      } while (!bVar2);
    }
    if (!bVar6) {
      pFVar3 = ppVar5->object;
      goto LAB_001cb403;
    }
  }
LAB_001cb3fc:
  pFVar3 = (Function *)0x0;
LAB_001cb403:
  if (pFVar3 != (Function *)0x0) {
    return pFVar3;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

Module& Module::createProcessor (Program& p)    { return p.getAllocator().allocate<Module> (p, ModuleType::processorModule); }